

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history_buffer.c
# Opt level: O0

void history_buffer_traceback
               (history_buffer *buf,shift_register_t bestpath,uint min_traceback_length,
               bit_writer_t *output)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bit_writer_t *in_RCX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  shift_register_t pathbit_1;
  uint8_t history_1;
  uint j_1;
  uint len;
  uint prefetch_index;
  shift_register_t pathbit;
  uint8_t history;
  uint j;
  uint cap;
  uint index;
  shift_register_t highbit;
  uint fetched_index;
  uint local_50;
  uint local_4c;
  uint local_40;
  uint local_38;
  uint local_2c;
  uint local_24;
  uint local_1c;
  uint local_c;
  
  local_1c = 0;
  uVar1 = *(uint *)(in_RDI + 0x10);
  local_24 = *(uint *)(in_RDI + 0x20);
  uVar2 = *(uint *)(in_RDI + 8);
  local_c = in_ESI;
  for (local_2c = 0; local_2c < in_EDX; local_2c = local_2c + 1) {
    if (local_24 == 0) {
      local_24 = uVar2;
    }
    local_24 = local_24 - 1;
    local_4c = uVar1;
    if (*(char *)(*(long *)(*(long *)(in_RDI + 0x18) + (ulong)local_24 * 8) + (ulong)local_c) ==
        '\0') {
      local_4c = 0;
    }
    local_c = (local_4c | local_c) >> 1;
  }
  if (local_24 == 0) {
    local_24 = uVar2;
  }
  uVar3 = *(uint *)(in_RDI + 0x24);
  for (local_40 = in_EDX; local_38 = local_24 - 1, local_40 < uVar3; local_40 = local_40 + 1) {
    local_24 = local_38;
    if (local_38 == 0) {
      local_24 = uVar2;
    }
    local_50 = uVar1;
    if (*(char *)(*(long *)(*(long *)(in_RDI + 0x18) + (ulong)local_38 * 8) + (ulong)local_c) ==
        '\0') {
      local_50 = 0;
    }
    local_c = (local_50 | local_c) >> 1;
    *(bool *)(*(long *)(in_RDI + 0x28) + (ulong)local_1c) = local_50 != 0;
    local_1c = local_1c + 1;
  }
  bit_writer_write_bitlist_reversed(in_RCX,*(uint8_t **)(in_RDI + 0x28),(ulong)local_1c);
  *(uint *)(in_RDI + 0x24) = *(int *)(in_RDI + 0x24) - local_1c;
  return;
}

Assistant:

void history_buffer_traceback(history_buffer *buf, shift_register_t bestpath,
                              unsigned int min_traceback_length, bit_writer_t *output) {
    unsigned int fetched_index = 0;
    shift_register_t highbit = buf->highbit;
    unsigned int index = buf->index;
    unsigned int cap = buf->cap;
    for (unsigned int j = 0; j < min_traceback_length; j++) {
        if (index == 0) {
            index = cap - 1;
        } else {
            index--;
        }
        // we're walking backwards from what the work we did before
        // so, we'll shift high order bits in
        // the path will cross multiple different shift register states, and we determine
        //   which state by going backwards one time slice at a time
        uint8_t history = buf->history[index][bestpath];
        shift_register_t pathbit = history ? highbit : 0;
        bestpath |= pathbit;
        bestpath >>= 1;
    }
    unsigned int prefetch_index = index;
    if (prefetch_index == 0) {
        prefetch_index = cap - 1;
    } else {
        prefetch_index--;
    }
    unsigned int len = buf->len;
    for (unsigned int j = min_traceback_length; j < len; j++) {
        index = prefetch_index;
        if (prefetch_index == 0) {
            prefetch_index = cap - 1;
        } else {
            prefetch_index--;
        }
        prefetch(buf->history[prefetch_index]);
        // we're walking backwards from what the work we did before
        // so, we'll shift high order bits in
        // the path will cross multiple different shift register states, and we determine
        //   which state by going backwards one time slice at a time
        uint8_t history = buf->history[index][bestpath];
        shift_register_t pathbit = history ? highbit : 0;
        bestpath |= pathbit;
        bestpath >>= 1;
        buf->fetched[fetched_index] = (pathbit ? 1 : 0);
        fetched_index++;
    }
    bit_writer_write_bitlist_reversed(output, buf->fetched, fetched_index);
    buf->len -= fetched_index;
}